

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trust_token.cc
# Opt level: O0

int TRUST_TOKEN_ISSUER_issue
              (TRUST_TOKEN_ISSUER *ctx,uint8_t **out,size_t *out_len,size_t *out_tokens_issued,
              uint8_t *request,size_t request_len,uint32_t public_metadata,uint8_t private_metadata,
              size_t max_issuance)

{
  int iVar1;
  size_t sVar2;
  undefined1 local_a0 [8];
  CBB response;
  ulong uStack_68;
  int ret;
  size_t num_to_issue;
  undefined1 local_58 [6];
  uint16_t num_requested;
  CBS in;
  trust_token_issuer_key_st *key;
  size_t request_len_local;
  uint8_t *request_local;
  size_t *out_tokens_issued_local;
  size_t *out_len_local;
  uint8_t **out_local;
  TRUST_TOKEN_ISSUER *ctx_local;
  
  if (ctx->max_batchsize < max_issuance) {
    max_issuance = (size_t)ctx->max_batchsize;
  }
  in.len = (size_t)trust_token_issuer_get_key(ctx,public_metadata);
  if ((((trust_token_issuer_key_st *)in.len == (trust_token_issuer_key_st *)0x0) ||
      (1 < private_metadata)) ||
     ((ctx->method->has_private_metadata == 0 && (private_metadata != '\0')))) {
    ERR_put_error(0x20,0,0x6a,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token.cc"
                  ,0x214);
    ctx_local._4_4_ = 0;
  }
  else {
    CBS_init((CBS *)local_58,request,request_len);
    iVar1 = CBS_get_u16((CBS *)local_58,(uint16_t *)((long)&num_to_issue + 6));
    if (iVar1 == 0) {
      ERR_put_error(0x20,0,0x69,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token.cc"
                    ,0x21c);
      ctx_local._4_4_ = 0;
    }
    else {
      uStack_68 = (ulong)num_to_issue._6_2_;
      if (max_issuance < uStack_68) {
        uStack_68 = max_issuance;
      }
      response.u._28_4_ = 0;
      iVar1 = CBB_init((CBB *)local_a0,0);
      if ((((iVar1 != 0) && (iVar1 = CBB_add_u16((CBB *)local_a0,(uint16_t)uStack_68), iVar1 != 0))
          && (iVar1 = CBB_add_u32((CBB *)local_a0,public_metadata), iVar1 != 0)) &&
         (iVar1 = (*ctx->method->sign)
                            ((TRUST_TOKEN_ISSUER_KEY *)(in.len + 8),(CBB *)local_a0,(CBS *)local_58,
                             (size_t)num_to_issue._6_2_,uStack_68,private_metadata), iVar1 != 0)) {
        sVar2 = CBS_len((CBS *)local_58);
        if (sVar2 == 0) {
          iVar1 = CBB_finish((CBB *)local_a0,out,out_len);
          if (iVar1 != 0) {
            *out_tokens_issued = uStack_68;
            response.u._28_4_ = 1;
          }
        }
        else {
          ERR_put_error(0x20,0,0x69,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token.cc"
                        ,0x232);
        }
      }
      CBB_cleanup((CBB *)local_a0);
      ctx_local._4_4_ = response.u._28_4_;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int TRUST_TOKEN_ISSUER_issue(const TRUST_TOKEN_ISSUER *ctx, uint8_t **out,
                             size_t *out_len, size_t *out_tokens_issued,
                             const uint8_t *request, size_t request_len,
                             uint32_t public_metadata, uint8_t private_metadata,
                             size_t max_issuance) {
  if (max_issuance > ctx->max_batchsize) {
    max_issuance = ctx->max_batchsize;
  }

  const struct trust_token_issuer_key_st *key =
      trust_token_issuer_get_key(ctx, public_metadata);
  if (key == NULL || private_metadata > 1 ||
      (!ctx->method->has_private_metadata && private_metadata != 0)) {
    OPENSSL_PUT_ERROR(TRUST_TOKEN, TRUST_TOKEN_R_INVALID_METADATA);
    return 0;
  }

  CBS in;
  uint16_t num_requested;
  CBS_init(&in, request, request_len);
  if (!CBS_get_u16(&in, &num_requested)) {
    OPENSSL_PUT_ERROR(TRUST_TOKEN, TRUST_TOKEN_R_DECODE_FAILURE);
    return 0;
  }

  size_t num_to_issue = num_requested;
  if (num_to_issue > max_issuance) {
    num_to_issue = max_issuance;
  }

  int ret = 0;
  CBB response;
  if (!CBB_init(&response, 0) || !CBB_add_u16(&response, num_to_issue) ||
      !CBB_add_u32(&response, public_metadata)) {
    goto err;
  }

  if (!ctx->method->sign(&key->key, &response, &in, num_requested, num_to_issue,
                         private_metadata)) {
    goto err;
  }

  if (CBS_len(&in) != 0) {
    OPENSSL_PUT_ERROR(TRUST_TOKEN, TRUST_TOKEN_R_DECODE_FAILURE);
    goto err;
  }

  if (!CBB_finish(&response, out, out_len)) {
    goto err;
  }

  *out_tokens_issued = num_to_issue;
  ret = 1;

err:
  CBB_cleanup(&response);
  return ret;
}